

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O0

void __thiscall txvalidationcache_tests::checkinputs_test::test_method(checkinputs_test *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  span<const_unsigned_char,_18446744073709551615UL> b_05;
  span<const_unsigned_char,_18446744073709551615UL> b_06;
  span<const_unsigned_char,_18446744073709551615UL> b_07;
  iterator __last;
  initializer_list<CMutableTransaction> __l;
  base_blob<256U> *pbVar5;
  bool bVar6;
  undefined1 uVar7;
  Txid *pTVar8;
  reference pvVar9;
  reference pvVar10;
  pointer pCVar11;
  lazy_ostream *pvChecks;
  CCoinsViewCache *pCVar12;
  iterator cache;
  Chainstate *pCVar13;
  CCoinsViewCache *pCVar14;
  Chainstate *creator;
  CCoinsViewCache *fromPubKey;
  lazy_ostream *plVar15;
  long in_FS_OFFSET;
  FillableSigningProvider *in_stack_ffffffffffffcb18;
  char *pcVar16;
  PrecomputedTransactionData *pPVar17;
  PrecomputedTransactionData *pPVar18;
  lazy_ostream *in_stack_ffffffffffffcb20;
  CBlock *this_00;
  lazy_ostream *plVar19;
  ChainstateManager *in_stack_ffffffffffffcb28;
  WitnessV0KeyHash *in_stack_ffffffffffffcb30;
  undefined4 in_stack_ffffffffffffcb38;
  int in_stack_ffffffffffffcb3c;
  FillableSigningProvider *in_stack_ffffffffffffcb40;
  CMutableTransaction *in_stack_ffffffffffffcb48;
  undefined4 in_stack_ffffffffffffcb50;
  uint in_stack_ffffffffffffcb54;
  undefined7 in_stack_ffffffffffffcb58;
  undefined1 in_stack_ffffffffffffcb5f;
  undefined7 in_stack_ffffffffffffcb60;
  undefined1 in_stack_ffffffffffffcb67;
  iterator in_stack_ffffffffffffcb68;
  TestChain100Setup *in_stack_ffffffffffffcb70;
  FillableSigningProvider *in_stack_ffffffffffffcb78;
  uint32_t in_stack_ffffffffffffcb80;
  int32_t in_stack_ffffffffffffcb84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffcb88;
  undefined7 in_stack_ffffffffffffcb90;
  undefined1 in_stack_ffffffffffffcb97;
  CKey *in_stack_ffffffffffffcb98;
  SignatureData *in_stack_ffffffffffffcba8;
  ValidationCache *in_stack_ffffffffffffcbc0;
  CCoinsViewCache *in_stack_ffffffffffffcbc8;
  undefined1 in_stack_ffffffffffffcbd3;
  uint32_t in_stack_ffffffffffffcbd4;
  CTransaction *in_stack_ffffffffffffcbd8;
  PrecomputedTransactionData *in_stack_ffffffffffffcc00;
  CCoinsViewCache *in_stack_ffffffffffffcc08;
  TxValidationState *in_stack_ffffffffffffcc10;
  TxValidationState *state_00;
  CTransaction *in_stack_ffffffffffffcc18;
  CTransaction *tx_00;
  SignatureData *in_stack_ffffffffffffcc30;
  SignatureData *sigdata_00;
  CScript *in_stack_ffffffffffffcc38;
  BaseSignatureCreator *in_stack_ffffffffffffcc40;
  SigningProvider *in_stack_ffffffffffffcc48;
  undefined8 in_stack_ffffffffffffcc50;
  SigVersion SVar20;
  undefined8 in_stack_ffffffffffffce10;
  undefined1 *puVar21;
  PrecomputedTransactionData *in_stack_ffffffffffffce18;
  PrecomputedTransactionData *in_stack_ffffffffffffce70;
  undefined7 in_stack_ffffffffffffce78;
  undefined1 in_stack_ffffffffffffce7f;
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> *in_stack_ffffffffffffce80;
  undefined1 *local_3140;
  int i;
  checkinputs_test *this_local;
  lazy_ostream local_2f34;
  undefined1 local_2f18 [64];
  const_string local_2ed8 [2];
  lazy_ostream local_2eb8 [2];
  assertion_result local_2e98 [2];
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks_1;
  const_string local_2e48 [2];
  lazy_ostream local_2e28 [2];
  assertion_result local_2e08 [2];
  const_string local_2dd0 [2];
  lazy_ostream local_2db0 [2];
  _Base_ptr local_2d90;
  assertion_result local_2d38 [2];
  CMutableTransaction tx;
  const_string local_2cc8 [2];
  lazy_ostream local_2ca8 [2];
  size_t local_2c88;
  assertion_result local_2c30 [2];
  CMutableTransaction valid_with_witness_tx;
  const_string local_2bc0 [2];
  lazy_ostream local_2ba0 [2];
  assertion_result local_2b80 [3];
  undefined1 local_2b21;
  const_string local_2b20 [2];
  lazy_ostream local_2b00 [2];
  assertion_result local_2ae0 [2];
  size_t local_2aa8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig_2;
  CMutableTransaction invalid_with_csv_tx;
  const_string local_2a50 [2];
  lazy_ostream local_2a30 [2];
  assertion_result local_2a10 [3];
  undefined1 local_29b1;
  const_string local_29b0 [2];
  lazy_ostream local_2990 [2];
  assertion_result local_2970 [2];
  _Base_ptr local_2938;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig_1;
  CMutableTransaction invalid_with_cltv_tx;
  undefined1 local_28c9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig2;
  CMutableTransaction invalid_under_p2sh_tx;
  const_string local_2878 [2];
  lazy_ostream local_2858 [2];
  assertion_result local_2838 [2];
  const_string local_2800 [2];
  lazy_ostream local_27e0 [2];
  assertion_result local_27c0 [3];
  undefined1 local_2764 [12];
  undefined1 local_2758 [16];
  undefined1 local_2748 [64];
  const_string local_2708 [2];
  lazy_ostream local_26e8 [2];
  assertion_result local_26c8 [2];
  vector<CScriptCheck,_std::allocator<CScriptCheck>_> scriptchecks;
  const_string local_2678 [2];
  lazy_ostream local_2658 [2];
  assertion_result local_2638 [3];
  undefined1 local_25ea;
  undefined1 local_25e9;
  const_string local_25e8 [2];
  lazy_ostream local_25c8 [2];
  assertion_result local_25a8 [2];
  undefined1 local_2570 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vchSig;
  CMutableTransaction spend_tx;
  const_string local_24c8 [2];
  lazy_ostream local_24a8 [2];
  assertion_result local_2488 [2];
  const_string local_2450 [2];
  lazy_ostream local_2430 [2];
  assertion_result local_2410 [4];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock20;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock19;
  PrecomputedTransactionData txdata_2;
  TxValidationState state_3;
  SignatureData sigdata_1;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 local_1970;
  _Rb_tree_impl<std::less<const_CBlockIndex_*>,_true> a_Stack_1968 [6];
  SignatureData sigdata;
  undefined8 local_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  PrecomputedTransactionData txdata_1;
  TxValidationState state_2;
  uint256 hash_2;
  undefined8 local_ff8;
  undefined8 uStack_ff0;
  undefined8 local_fe8;
  undefined8 uStack_fe0;
  PrecomputedTransactionData txdata;
  TxValidationState state_1;
  uint256 hash_1;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined8 local_cf8;
  undefined8 uStack_cf0;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined1 local_c28 [96];
  undefined1 local_bc8 [56];
  undefined1 local_b90 [112];
  CBlock block;
  PrecomputedTransactionData ptd_spend_tx;
  TxValidationState state;
  uint256 hash;
  FillableSigningProvider keystore;
  CScript p2wpkh_scriptPubKey;
  CScript p2pkh_scriptPubKey;
  CScript p2sh_scriptPubKey;
  CScript p2pk_scriptPubKey;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)in_stack_ffffffffffffcb18);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffcb40);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb20);
  b._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                      (opcodetype)((ulong)in_stack_ffffffffffffcb48 >> 0x20));
  CScript::CScript((CScript *)in_stack_ffffffffffffcb18,(CScript *)0xbd8993);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb28);
  CScript::~CScript((CScript *)in_stack_ffffffffffffcb18);
  ScriptHash::ScriptHash
            ((ScriptHash *)in_stack_ffffffffffffcb30,(CScript *)in_stack_ffffffffffffcb28);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffcb28,(ScriptHash *)in_stack_ffffffffffffcb20);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffcb18);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffcb18);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffcb40);
  PKHash::PKHash((PKHash *)in_stack_ffffffffffffcb30,(CPubKey *)in_stack_ffffffffffffcb28);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash,void,void,PKHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffcb28,(PKHash *)in_stack_ffffffffffffcb20);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffcb18);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffcb18);
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffcb40);
  WitnessV0KeyHash::WitnessV0KeyHash(in_stack_ffffffffffffcb30,(CPubKey *)in_stack_ffffffffffffcb28)
  ;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<WitnessV0KeyHash,void,void,WitnessV0KeyHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffcb28,(WitnessV0KeyHash *)in_stack_ffffffffffffcb20);
  GetScriptForDestination((CTxDestination *)in_stack_ffffffffffffcb18);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_ffffffffffffcb18);
  FillableSigningProvider::FillableSigningProvider(in_stack_ffffffffffffcb18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,
               (pointer)in_stack_ffffffffffffcb20,(unsigned_long)in_stack_ffffffffffffcb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    FillableSigningProvider::AddKey
              (in_stack_ffffffffffffcb40,
               (CKey *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,
               SUB81((ulong)in_stack_ffffffffffffcb20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,
               (pointer)in_stack_ffffffffffffcb20,(unsigned_long)in_stack_ffffffffffffcb18);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffcb20,(basic_cstring<const_char> *)in_stack_ffffffffffffcb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,
               (pointer)in_stack_ffffffffffffcb20,(unsigned_long)in_stack_ffffffffffffcb18);
    in_stack_ffffffffffffcb18 = (FillableSigningProvider *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2410,local_2430,local_2450,0xb1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffcb18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb18);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,
               (pointer)in_stack_ffffffffffffcb20,(unsigned_long)in_stack_ffffffffffffcb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb18);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    FillableSigningProvider::AddCScript
              (in_stack_ffffffffffffcb78,(CScript *)in_stack_ffffffffffffcb70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,
               SUB81((ulong)in_stack_ffffffffffffcb20 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,
               (pointer)in_stack_ffffffffffffcb20,(unsigned_long)in_stack_ffffffffffffcb18);
    boost::unit_test::operator<<
              (in_stack_ffffffffffffcb20,(basic_cstring<const_char> *)in_stack_ffffffffffffcb18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,
               (pointer)in_stack_ffffffffffffcb20,(unsigned_long)in_stack_ffffffffffffcb18);
    in_stack_ffffffffffffcb18 = (FillableSigningProvider *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2488,local_24a8,local_24c8,0xb2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffcb18);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb18);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
    SVar20 = (SigVersion)in_stack_ffffffffffffce10;
  } while (bVar6);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_ffffffffffffcb18);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffcb28,(size_type)in_stack_ffffffffffffcb20);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffcb18);
  pTVar8 = CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffcb18);
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)in_stack_ffffffffffffcb20);
  uVar2 = *(undefined8 *)(pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems;
  uVar3 = *(undefined8 *)((pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
  uVar4 = *(undefined8 *)((pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       *(undefined8 *)((pTVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uVar4;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = uVar2;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uVar3;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)in_stack_ffffffffffffcb20);
  (pvVar9->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)in_stack_ffffffffffffcb20);
  pvVar10->nValue = 11000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
             (size_type)in_stack_ffffffffffffcb20);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)in_stack_ffffffffffffcb20);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)in_stack_ffffffffffffcb20);
  pvVar10->nValue = 11000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
             (size_type)in_stack_ffffffffffffcb20);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)in_stack_ffffffffffffcb20);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)in_stack_ffffffffffffcb20);
  pvVar10->nValue = 11000000;
  CScript::CScript((CScript *)in_stack_ffffffffffffcb18);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                      (opcodetype)((ulong)in_stack_ffffffffffffcb48 >> 0x20));
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                      (opcodetype)((ulong)in_stack_ffffffffffffcb48 >> 0x20));
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffcb40);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb20);
  b_00._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_00._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_00._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_00._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_00)
  ;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                      (opcodetype)((ulong)in_stack_ffffffffffffcb48 >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
             (size_type)in_stack_ffffffffffffcb20);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)in_stack_ffffffffffffcb20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb28);
  CScript::~CScript((CScript *)in_stack_ffffffffffffcb18);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)in_stack_ffffffffffffcb20);
  pvVar10->nValue = 11000000;
  CScript::CScript((CScript *)in_stack_ffffffffffffcb18);
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                      (opcodetype)((ulong)in_stack_ffffffffffffcb48 >> 0x20));
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                      (opcodetype)((ulong)in_stack_ffffffffffffcb48 >> 0x20));
  CKey::GetPubKey((CKey *)in_stack_ffffffffffffcb40);
  ToByteVector<CPubKey>((CPubKey *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58));
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb20);
  b_01._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_01._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_01._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_01._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_01)
  ;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                      (opcodetype)((ulong)in_stack_ffffffffffffcb48 >> 0x20));
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
             (size_type)in_stack_ffffffffffffcb20);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)in_stack_ffffffffffffcb20);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb28);
  CScript::~CScript((CScript *)in_stack_ffffffffffffcb18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb18);
  local_2570 = (undefined1  [8])0x0;
  this_00 = (CBlock *)0x0;
  pcVar16 = (char *)((ulong)in_stack_ffffffffffffcb18 & 0xffffffff00000000);
  SignatureHash<CMutableTransaction>
            ((CScript *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
             (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb84,
             (CAmount *)in_stack_ffffffffffffcb48,SVar20,in_stack_ffffffffffffce18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CKey::Sign(in_stack_ffffffffffffcb98,
               (uint256 *)CONCAT17(in_stack_ffffffffffffcb97,in_stack_ffffffffffffcb90),
               in_stack_ffffffffffffcb88,SUB41((uint)in_stack_ffffffffffffcb84 >> 0x18,0),
               in_stack_ffffffffffffcb80);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)this_00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_25a8,local_25c8,local_25e8,0xcc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  local_25e9 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar16,
             (value_type_conflict3 *)0xbd93e0);
  local_25ea = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar16,
             (value_type_conflict3 *)0xbd93ff);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)this_00);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  b_02._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_02._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_02._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_02._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_02)
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar16);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
             (char *)in_stack_ffffffffffffcb48,(char *)in_stack_ffffffffffffcb40,
             in_stack_ffffffffffffcb3c,SUB41((uint)in_stack_ffffffffffffcb38 >> 0x18,0));
  TxValidationState::TxValidationState((TxValidationState *)pcVar16);
  PrecomputedTransactionData::PrecomputedTransactionData((PrecomputedTransactionData *)pcVar16);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50))
    ;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)in_stack_ffffffffffffcb68.ptr,
               (CCoinsView *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
               (bool)in_stack_ffffffffffffcb5f);
    pCVar11 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::
              operator->((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                         pcVar16);
    this_00 = (CBlock *)&pCVar11->m_validation_cache;
    pPVar17 = &ptd_spend_tx;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)0x0;
    CheckInputScripts(in_stack_ffffffffffffcc18,in_stack_ffffffffffffcc10,in_stack_ffffffffffffcc08,
                      (uint)((ulong)in_stack_ffffffffffffcc50 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x30,0),in_stack_ffffffffffffce70,
                      (ValidationCache *)
                      CONCAT17(in_stack_ffffffffffffce7f,in_stack_ffffffffffffce78),
                      in_stack_ffffffffffffce80);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)this_00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pPVar17);
    boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pPVar17);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pPVar17);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2638,local_2658,local_2678,0xdb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)pcVar16);
    CTransaction::~CTransaction((CTransaction *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)pcVar16)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50))
    ;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)in_stack_ffffffffffffcb68.ptr,
               (CCoinsView *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
               (bool)in_stack_ffffffffffffcb5f);
    pCVar11 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::
              operator->((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                         pcVar16);
    this_00 = (CBlock *)&pCVar11->m_validation_cache;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)&scriptchecks;
    pPVar17 = &ptd_spend_tx;
    CheckInputScripts(in_stack_ffffffffffffcc18,in_stack_ffffffffffffcc10,in_stack_ffffffffffffcc08,
                      (uint)((ulong)in_stack_ffffffffffffcc50 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x30,0),in_stack_ffffffffffffce70,
                      (ValidationCache *)
                      CONCAT17(in_stack_ffffffffffffce7f,in_stack_ffffffffffffce78),
                      in_stack_ffffffffffffce80);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)this_00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pPVar17);
    boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pPVar17);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pPVar17);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_26c8,local_26e8,local_2708,0xe1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)pcVar16);
    CTransaction::~CTransaction((CTransaction *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<((lazy_ostream *)this_00,(char (*) [1])pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    local_2764._4_8_ =
         std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::size
                   ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                    pcVar16);
    local_2764._0_4_ = 1;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)0x1bc11bb;
    this_00 = (CBlock *)local_2764;
    pcVar16 = "scriptchecks.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_2748,local_2758,0xe2,1,2,local_2764 + 4);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
  Chainstate::CoinsTip((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ValidateCheckInputsForAllFlags
            (in_stack_ffffffffffffcbd8,in_stack_ffffffffffffcbd4,(bool)in_stack_ffffffffffffcbd3,
             in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  CTransaction::~CTransaction((CTransaction *)pcVar16);
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_ffffffffffffcb28);
  PrecomputedTransactionData::~PrecomputedTransactionData((PrecomputedTransactionData *)pcVar16);
  TxValidationState::~TxValidationState((TxValidationState *)pcVar16);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar16);
  CBlock::CBlock((CBlock *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  CMutableTransaction::CMutableTransaction
            (in_stack_ffffffffffffcb48,(CMutableTransaction *)in_stack_ffffffffffffcb40);
  std::allocator<CMutableTransaction>::allocator((allocator<CMutableTransaction> *)pcVar16);
  __l._M_array._7_1_ = in_stack_ffffffffffffcb67;
  __l._M_array._0_7_ = in_stack_ffffffffffffcb60;
  __l._M_len = (size_type)in_stack_ffffffffffffcb68.ptr;
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),__l,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  TestChain100Setup::CreateAndProcessBlock
            (in_stack_ffffffffffffcb70,
             (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffcb68.ptr,
             (CScript *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
             (Chainstate *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58));
  CBlock::operator=((CBlock *)in_stack_ffffffffffffcb28,this_00);
  CBlock::~CBlock((CBlock *)pcVar16);
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
            ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
             in_stack_ffffffffffffcb28);
  std::allocator<CMutableTransaction>::~allocator((allocator<CMutableTransaction> *)pcVar16);
  local_3140 = local_b90;
  do {
    local_3140 = local_3140 + -0x38;
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar16);
  } while (local_3140 != local_bc8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)pcVar16);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
             (char *)in_stack_ffffffffffffcb48,(char *)in_stack_ffffffffffffcb40,
             in_stack_ffffffffffffcb3c,SUB41((uint)in_stack_ffffffffffffcb38 >> 0x18,0));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
    ChainstateManager::ActiveChain((ChainstateManager *)pcVar16);
    CChain::Tip((CChain *)in_stack_ffffffffffffcb28);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_ffffffffffffcb28);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffcb28,(base_blob<256U> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)this_00 >> 0x38,0));
    pvChecks = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_27c0,local_27e0,local_2800,0xf1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    uVar7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar7);
  do {
    pPVar17 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
    pCVar12 = Chainstate::CoinsTip
                        ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38)
                        );
    (*(pCVar12->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView[2])(local_c28);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    ::operator==((base_blob<256U> *)in_stack_ffffffffffffcb28,(base_blob<256U> *)this_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)this_00 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    boost::unit_test::operator<<((lazy_ostream *)this_00,(basic_cstring<const_char> *)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)this_00,
               (unsigned_long)pcVar16);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2838,local_2858,local_2878,0xf2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pcVar16);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)this_00);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_c58;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_c50;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_c68;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_c60;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)this_00);
  (pvVar9->prevout).n = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)this_00);
  pvVar10->nValue = 11000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,(size_type)this_00
            );
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)this_00);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this_00);
  cache = prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)this_00);
  puVar21 = &local_28c9;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)pcVar16);
  __last.ptr._7_1_ = in_stack_ffffffffffffcb67;
  __last.ptr._0_7_ = in_stack_ffffffffffffcb60;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<prevector<28u,unsigned_char,unsigned_int,int>::iterator,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb48,
             in_stack_ffffffffffffcb68,__last,(allocator_type *)in_stack_ffffffffffffcb40);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)pcVar16);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)this_00);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00);
  b_03._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_03._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_03._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_03._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_03)
  ;
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
  Chainstate::CoinsTip((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ValidateCheckInputsForAllFlags
            (in_stack_ffffffffffffcbd8,in_stack_ffffffffffffcbd4,(bool)in_stack_ffffffffffffcbd3,
             in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  CTransaction::~CTransaction((CTransaction *)pcVar16);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb28);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar16);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pcVar16);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)this_00);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_cf8;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_cf0;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_d08;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_d00;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)this_00);
  (pvVar9->prevout).n = 2;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)this_00);
  pvVar9->nSequence = 0;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)this_00);
  pvVar10->nValue = 11000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,(size_type)this_00
            );
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)this_00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar16);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,(size_type)this_00
            );
  local_2938 = (_Base_ptr)0x0;
  plVar19 = (lazy_ostream *)0x0;
  pPVar18 = (PrecomputedTransactionData *)((ulong)pcVar16 & 0xffffffff00000000);
  SignatureHash<CMutableTransaction>
            ((CScript *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
             (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb84,
             (CAmount *)in_stack_ffffffffffffcb48,(SigVersion)puVar21,
             (PrecomputedTransactionData *)cache.ptr);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pPVar18)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CKey::Sign(in_stack_ffffffffffffcb98,
               (uint256 *)CONCAT17(in_stack_ffffffffffffcb97,in_stack_ffffffffffffcb90),
               in_stack_ffffffffffffcb88,SUB41((uint)in_stack_ffffffffffffcb84 >> 0x18,0),
               in_stack_ffffffffffffcb80);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pPVar18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    pPVar18 = (PrecomputedTransactionData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2970,local_2990,local_29b0,0x115,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pPVar18);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pPVar18);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  local_29b1 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pPVar18,
             (value_type_conflict3 *)0xbda665);
  CScript::CScript((CScript *)pPVar18);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)plVar19);
  b_04._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_04._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_04._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_04._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_04)
  ;
  CScript::operator<<((CScript *)in_stack_ffffffffffffcb28,(int64_t)plVar19);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)plVar19);
  CScript::~CScript((CScript *)pPVar18);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pPVar18);
  ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
  Chainstate::CoinsTip((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pPVar18);
  ValidateCheckInputsForAllFlags
            (in_stack_ffffffffffffcbd8,in_stack_ffffffffffffcbd4,(bool)in_stack_ffffffffffffcbd3,
             in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  CTransaction::~CTransaction((CTransaction *)pPVar18);
  CScript::CScript((CScript *)pPVar18);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)plVar19);
  b_05._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_05._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_05._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_05._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_05)
  ;
  CScript::operator<<((CScript *)in_stack_ffffffffffffcb28,(int64_t)plVar19);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)plVar19);
  CScript::~CScript((CScript *)pPVar18);
  TxValidationState::TxValidationState((TxValidationState *)pPVar18);
  PrecomputedTransactionData::PrecomputedTransactionData(pPVar18);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pPVar18)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50))
    ;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pPVar18);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    pCVar11 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::
              operator->((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                         pPVar18);
    plVar19 = (lazy_ostream *)&pCVar11->m_validation_cache;
    pPVar18 = &txdata;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)0x0;
    CheckInputScripts(in_stack_ffffffffffffcc18,in_stack_ffffffffffffcc10,in_stack_ffffffffffffcc08,
                      (uint)((ulong)in_stack_ffffffffffffcc50 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x30,0),pPVar17,
                      (ValidationCache *)CONCAT17(uVar7,in_stack_ffffffffffffce78),
                      (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)pvChecks);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pPVar18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    pPVar18 = (PrecomputedTransactionData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2a10,local_2a30,local_2a50,0x11f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pPVar18);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pPVar18);
    CTransaction::~CTransaction((CTransaction *)pPVar18);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
    SVar20 = (SigVersion)puVar21;
  } while (bVar6);
  PrecomputedTransactionData::~PrecomputedTransactionData(pPVar18);
  TxValidationState::~TxValidationState((TxValidationState *)pPVar18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb28);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pPVar18);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pPVar18);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_fe8;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_fe0;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_ff8;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_ff0;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  (pvVar9->prevout).n = 3;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  pvVar9->nSequence = 100;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)plVar19);
  pvVar10->nValue = 11000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19
            );
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)plVar19);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pPVar18);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19
            );
  local_2aa8 = 0;
  plVar19 = (lazy_ostream *)0x0;
  pcVar16 = (char *)((ulong)pPVar18 & 0xffffffff00000000);
  SignatureHash<CMutableTransaction>
            ((CScript *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
             (CMutableTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb84,
             (CAmount *)in_stack_ffffffffffffcb48,SVar20,(PrecomputedTransactionData *)cache.ptr);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CKey::Sign(in_stack_ffffffffffffcb98,
               (uint256 *)CONCAT17(in_stack_ffffffffffffcb97,in_stack_ffffffffffffcb90),
               in_stack_ffffffffffffcb88,SUB41((uint)in_stack_ffffffffffffcb84 >> 0x18,0),
               in_stack_ffffffffffffcb80);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2ae0,local_2b00,local_2b20,0x131,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  local_2b21 = 1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar16,
             (value_type_conflict3 *)0xbdadfc);
  CScript::CScript((CScript *)pcVar16);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)plVar19);
  b_06._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_06._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_06._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_06._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_06)
  ;
  CScript::operator<<((CScript *)in_stack_ffffffffffffcb28,(int64_t)plVar19);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)plVar19);
  CScript::~CScript((CScript *)pcVar16);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
  Chainstate::CoinsTip((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ValidateCheckInputsForAllFlags
            (in_stack_ffffffffffffcbd8,in_stack_ffffffffffffcbd4,(bool)in_stack_ffffffffffffcbd3,
             in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  CTransaction::~CTransaction((CTransaction *)pcVar16);
  CScript::CScript((CScript *)pcVar16);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_ffffffffffffcb28,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)plVar19);
  b_07._M_ptr._4_4_ = in_stack_ffffffffffffcb54;
  b_07._M_ptr._0_4_ = in_stack_ffffffffffffcb50;
  b_07._M_extent._M_extent_value._0_7_ = in_stack_ffffffffffffcb58;
  b_07._M_extent._M_extent_value._7_1_ = in_stack_ffffffffffffcb5f;
  CScript::operator<<((CScript *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),b_07)
  ;
  CScript::operator<<((CScript *)in_stack_ffffffffffffcb28,(int64_t)plVar19);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19);
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)plVar19);
  CScript::~CScript((CScript *)pcVar16);
  TxValidationState::TxValidationState((TxValidationState *)pcVar16);
  PrecomputedTransactionData::PrecomputedTransactionData((PrecomputedTransactionData *)pcVar16);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50))
    ;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)in_stack_ffffffffffffcb68.ptr,
               (CCoinsView *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
               (bool)in_stack_ffffffffffffcb5f);
    pCVar11 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::
              operator->((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                         pcVar16);
    plVar19 = (lazy_ostream *)&pCVar11->m_validation_cache;
    pPVar18 = &txdata_1;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)0x0;
    CheckInputScripts(in_stack_ffffffffffffcc18,in_stack_ffffffffffffcc10,in_stack_ffffffffffffcc08,
                      (uint)((ulong)in_stack_ffffffffffffcc50 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x30,0),pPVar17,
                      (ValidationCache *)CONCAT17(uVar7,in_stack_ffffffffffffce78),
                      (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)pvChecks);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pPVar18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2b80,local_2ba0,local_2bc0,0x13b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)pcVar16);
    CTransaction::~CTransaction((CTransaction *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  PrecomputedTransactionData::~PrecomputedTransactionData((PrecomputedTransactionData *)pcVar16);
  TxValidationState::~TxValidationState((TxValidationState *)pcVar16);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffcb28);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar16);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pcVar16);
  valid_with_witness_tx.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_14a0;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       uStack_1498;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_14b0
  ;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_14a8;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  (pvVar9->prevout).n = 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)plVar19);
  pvVar10->nValue = 11000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19
            );
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)plVar19);
  SignatureData::SignatureData(in_stack_ffffffffffffcba8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    local_2c88 = 11000000;
    MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
              ((MutableTransactionSignatureCreator *)
               CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (uint)((ulong)in_stack_ffffffffffffcb48 >> 0x20),(CAmount *)in_stack_ffffffffffffcb40
               ,in_stack_ffffffffffffcb3c);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
               (size_type)plVar19);
    ProduceSignature(in_stack_ffffffffffffcc48,in_stack_ffffffffffffcc40,in_stack_ffffffffffffcc38,
                     in_stack_ffffffffffffcc30);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2c30,local_2ca8,local_2cc8,0x14e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    MutableTransactionSignatureCreator::~MutableTransactionSignatureCreator
              ((MutableTransactionSignatureCreator *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19);
  UpdateInput((CTxIn *)pcVar16,(SignatureData *)0xbdb590);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  pCVar13 = ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
  pCVar14 = Chainstate::CoinsTip
                      ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ValidateCheckInputsForAllFlags
            (in_stack_ffffffffffffcbd8,in_stack_ffffffffffffcbd4,(bool)in_stack_ffffffffffffcbd3,
             in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  CTransaction::~CTransaction((CTransaction *)pcVar16);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19);
  CScriptWitness::SetNull((CScriptWitness *)pcVar16);
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  creator = ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
  fromPubKey = Chainstate::CoinsTip
                         ((Chainstate *)
                          CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ValidateCheckInputsForAllFlags
            (in_stack_ffffffffffffcbd8,in_stack_ffffffffffffcbd4,(bool)in_stack_ffffffffffffcbd3,
             in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  CTransaction::~CTransaction((CTransaction *)pcVar16);
  SignatureData::~SignatureData((SignatureData *)pcVar16);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar16);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)pcVar16);
  tx.version = 1;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::resize
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  sigdata_00 = (SignatureData *)0x0;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  *(_Base_ptr *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       a_Stack_1968[0].super__Rb_tree_header._M_header._M_left;
  *(_Base_ptr *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) =
       a_Stack_1968[0].super__Rb_tree_header._M_header._M_right;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
       a_Stack_1968[0].super__Rb_tree_header._M_header._0_8_;
  *(_Base_ptr *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       a_Stack_1968[0].super__Rb_tree_header._M_header._M_parent;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  (pvVar9->prevout).n = 0;
  CMutableTransaction::GetHash
            ((CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  tx_00 = (CTransaction *)&tx;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) =
       local_1970;
  pbVar5 = &(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>;
  (pbVar5->m_data)._M_elems[0x18] = a_Stack_1968[0]._0_1_;
  (pbVar5->m_data)._M_elems[0x19] = a_Stack_1968[0]._1_1_;
  (pbVar5->m_data)._M_elems[0x1a] = a_Stack_1968[0]._2_1_;
  (pbVar5->m_data)._M_elems[0x1b] = a_Stack_1968[0]._3_1_;
  (pbVar5->m_data)._M_elems[0x1c] = a_Stack_1968[0]._4_1_;
  (pbVar5->m_data)._M_elems[0x1d] = a_Stack_1968[0]._5_1_;
  (pbVar5->m_data)._M_elems[0x1e] = a_Stack_1968[0]._6_1_;
  (pbVar5->m_data)._M_elems[0x1f] = a_Stack_1968[0]._7_1_;
  *(undefined8 *)(pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems = local_1980
  ;
  *(undefined8 *)((pvVar9->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
       uStack_1978;
  pvVar9 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                     ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,
                      (size_type)plVar19);
  (pvVar9->prevout).n = 1;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::resize
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)
             CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38),
             (size_type)in_stack_ffffffffffffcb30);
  pCVar12 = (CCoinsViewCache *)&tx.vout;
  state_00 = (TxValidationState *)0x0;
  pvVar10 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                      ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                       (size_type)plVar19);
  pvVar10->nValue = 22000000;
  std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19
            );
  CScript::operator=((CScript *)in_stack_ffffffffffffcb28,(CScript *)plVar19);
  for (i = 0; i < 2; i = i + 1) {
    SignatureData::SignatureData(in_stack_ffffffffffffcba8);
    do {
      in_stack_ffffffffffffcc00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
                 (unsigned_long)pcVar16);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pcVar16);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
                 (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                 (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
      local_2d90 = (_Base_ptr)0xa7d8c0;
      MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
                ((MutableTransactionSignatureCreator *)
                 CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
                 (CMutableTransaction *)
                 CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
                 (uint)((ulong)in_stack_ffffffffffffcb48 >> 0x20),
                 (CAmount *)in_stack_ffffffffffffcb40,in_stack_ffffffffffffcb3c);
      std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_ffffffffffffcb28,
                 (size_type)plVar19);
      ProduceSignature((SigningProvider *)pCVar14,(BaseSignatureCreator *)creator,
                       (CScript *)fromPubKey,sigdata_00);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
                 (unsigned_long)pcVar16);
      boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pcVar16);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
                 (unsigned_long)pcVar16);
      pcVar16 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_2d38,local_2db0,local_2dd0,0x16a,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)pcVar16);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
      MutableTransactionSignatureCreator::~MutableTransactionSignatureCreator
                ((MutableTransactionSignatureCreator *)pcVar16);
      bVar6 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar6);
    std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19
              );
    UpdateInput((CTxIn *)pcVar16,(SignatureData *)0xbdba91);
    SignatureData::~SignatureData((SignatureData *)pcVar16);
  }
  CTransaction::CTransaction
            ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
             (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
  Chainstate::CoinsTip((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
  ValidateCheckInputsForAllFlags
            (in_stack_ffffffffffffcbd8,in_stack_ffffffffffffcbd4,(bool)in_stack_ffffffffffffcbd3,
             in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  CTransaction::~CTransaction((CTransaction *)pcVar16);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
            ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_ffffffffffffcb28,(size_type)plVar19);
  CScriptWitness::SetNull((CScriptWitness *)pcVar16);
  TxValidationState::TxValidationState((TxValidationState *)pcVar16);
  PrecomputedTransactionData::PrecomputedTransactionData((PrecomputedTransactionData *)pcVar16);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50))
    ;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
    Chainstate::CoinsTip
              ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38));
    CCoinsViewCache::CCoinsViewCache
              ((CCoinsViewCache *)in_stack_ffffffffffffcb68.ptr,
               (CCoinsView *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
               (bool)in_stack_ffffffffffffcb5f);
    pCVar11 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::
              operator->((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                         pcVar16);
    plVar19 = (lazy_ostream *)&pCVar11->m_validation_cache;
    pPVar18 = &txdata_2;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)0x0;
    CheckInputScripts(tx_00,state_00,pCVar12,(uint)((ulong)pCVar13 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0),
                      SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x30,0),pPVar17,
                      (ValidationCache *)CONCAT17(uVar7,in_stack_ffffffffffffce78),
                      (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)pvChecks);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pPVar18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e08,local_2e28,local_2e48,0x179,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)pcVar16);
    CTransaction::~CTransaction((CTransaction *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)pcVar16)
  ;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)in_stack_ffffffffffffcb48,(const_string *)in_stack_ffffffffffffcb40);
    CTransaction::CTransaction
              ((CTransaction *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (CMutableTransaction *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50))
    ;
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)pcVar16);
    ChainstateManager::ActiveChainstate(in_stack_ffffffffffffcb28);
    pCVar14 = Chainstate::CoinsTip
                        ((Chainstate *)CONCAT44(in_stack_ffffffffffffcb3c,in_stack_ffffffffffffcb38)
                        );
    CCoinsViewCache::CCoinsViewCache
              (pCVar14,(CCoinsView *)CONCAT17(in_stack_ffffffffffffcb67,in_stack_ffffffffffffcb60),
               (bool)in_stack_ffffffffffffcb5f);
    pCVar11 = std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::
              operator->((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
                         pcVar16);
    plVar19 = (lazy_ostream *)&pCVar11->m_validation_cache;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)&scriptchecks_1;
    pPVar18 = &txdata_2;
    in_stack_ffffffffffffcb67 =
         CheckInputScripts(tx_00,state_00,pCVar12,(uint)((ulong)pCVar13 >> 0x20),
                           SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x38,0),
                           SUB81((ulong)in_stack_ffffffffffffcc00 >> 0x30,0),pPVar17,
                           (ValidationCache *)CONCAT17(uVar7,in_stack_ffffffffffffce78),
                           (vector<CScriptCheck,_std::allocator<CScriptCheck>_> *)pvChecks);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffcb28,SUB81((ulong)plVar19 >> 0x38,0));
    plVar15 = boost::unit_test::lazy_ostream::instance();
    in_stack_ffffffffffffcb58 = SUB87(plVar15,0);
    in_stack_ffffffffffffcb5f = (undefined1)((ulong)plVar15 >> 0x38);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    boost::unit_test::operator<<(plVar19,(basic_cstring<const_char> *)pPVar18);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pPVar18);
    pcVar16 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_2e98,local_2eb8,local_2ed8,0x17e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pcVar16);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pcVar16);
    CCoinsViewCache::~CCoinsViewCache((CCoinsViewCache *)pcVar16);
    CTransaction::~CTransaction((CTransaction *)pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffcb54 = CONCAT13(bVar6,(int3)in_stack_ffffffffffffcb54);
  } while (bVar6);
  do {
    pPVar17 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pcVar16)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffcb5f,in_stack_ffffffffffffcb58),
               (const_string *)CONCAT44(in_stack_ffffffffffffcb54,in_stack_ffffffffffffcb50),
               (size_t)pPVar17,(const_string *)in_stack_ffffffffffffcb40);
    in_stack_ffffffffffffcb40 =
         (FillableSigningProvider *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(plVar19,(char (*) [1])pcVar16);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffcb28,(pointer)plVar19,
               (unsigned_long)pcVar16);
    local_2f34._4_8_ =
         std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::size
                   ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                    pcVar16);
    local_2f34._vptr_lazy_ostream._0_4_ = 2;
    in_stack_ffffffffffffcb28 = (ChainstateManager *)0x1c2381d;
    plVar19 = &local_2f34;
    pcVar16 = "scriptchecks.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_2f18,&local_2f34.field_0xc,0x180,1,2,
               (undefined1 *)((long)&local_2f34._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               pcVar16);
    bVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar6);
  std::vector<CScriptCheck,_std::allocator<CScriptCheck>_>::~vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_ffffffffffffcb28);
  PrecomputedTransactionData::~PrecomputedTransactionData((PrecomputedTransactionData *)pcVar16);
  TxValidationState::~TxValidationState((TxValidationState *)pcVar16);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar16);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)pcVar16);
  CBlock::~CBlock((CBlock *)pcVar16);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)pcVar16);
  FillableSigningProvider::~FillableSigningProvider((FillableSigningProvider *)pcVar16);
  CScript::~CScript((CScript *)pcVar16);
  CScript::~CScript((CScript *)pcVar16);
  CScript::~CScript((CScript *)pcVar16);
  CScript::~CScript((CScript *)pcVar16);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(checkinputs_test, Dersig100Setup)
{
    // Test that passing CheckInputScripts with one set of script flags doesn't imply
    // that we would pass again with a different set of flags.
    CScript p2pk_scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    CScript p2sh_scriptPubKey = GetScriptForDestination(ScriptHash(p2pk_scriptPubKey));
    CScript p2pkh_scriptPubKey = GetScriptForDestination(PKHash(coinbaseKey.GetPubKey()));
    CScript p2wpkh_scriptPubKey = GetScriptForDestination(WitnessV0KeyHash(coinbaseKey.GetPubKey()));

    FillableSigningProvider keystore;
    BOOST_CHECK(keystore.AddKey(coinbaseKey));
    BOOST_CHECK(keystore.AddCScript(p2pk_scriptPubKey));

    // flags to test: SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, SCRIPT_VERIFY_CHECKSEQUENCE_VERIFY, SCRIPT_VERIFY_NULLDUMMY, uncompressed pubkey thing

    // Create 2 outputs that match the three scripts above, spending the first
    // coinbase tx.
    CMutableTransaction spend_tx;

    spend_tx.version = 1;
    spend_tx.vin.resize(1);
    spend_tx.vin[0].prevout.hash = m_coinbase_txns[0]->GetHash();
    spend_tx.vin[0].prevout.n = 0;
    spend_tx.vout.resize(4);
    spend_tx.vout[0].nValue = 11*CENT;
    spend_tx.vout[0].scriptPubKey = p2sh_scriptPubKey;
    spend_tx.vout[1].nValue = 11*CENT;
    spend_tx.vout[1].scriptPubKey = p2wpkh_scriptPubKey;
    spend_tx.vout[2].nValue = 11*CENT;
    spend_tx.vout[2].scriptPubKey = CScript() << OP_CHECKLOCKTIMEVERIFY << OP_DROP << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    spend_tx.vout[3].nValue = 11*CENT;
    spend_tx.vout[3].scriptPubKey = CScript() << OP_CHECKSEQUENCEVERIFY << OP_DROP << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;

    // Sign, with a non-DER signature
    {
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(p2pk_scriptPubKey, spend_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char) 0); // padding byte makes this non-DER
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        spend_tx.vin[0].scriptSig << vchSig;
    }

    // Test that invalidity under a set of flags doesn't preclude validity
    // under other (eg consensus) flags.
    // spend_tx is invalid according to DERSIG
    {
        LOCK(cs_main);

        TxValidationState state;
        PrecomputedTransactionData ptd_spend_tx;

        BOOST_CHECK(!CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, nullptr));

        // If we call again asking for scriptchecks (as happens in
        // ConnectBlock), we should add a script check object for this -- we're
        // not caching invalidity (if that changes, delete this test case).
        std::vector<CScriptCheck> scriptchecks;
        BOOST_CHECK(CheckInputScripts(CTransaction(spend_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_DERSIG, true, true, ptd_spend_tx, m_node.chainman->m_validation_cache, &scriptchecks));
        BOOST_CHECK_EQUAL(scriptchecks.size(), 1U);

        // Test that CheckInputScripts returns true iff DERSIG-enforcing flags are
        // not present.  Don't add these checks to the cache, so that we can
        // test later that block validation works fine in the absence of cached
        // successes.
        ValidateCheckInputsForAllFlags(CTransaction(spend_tx), SCRIPT_VERIFY_DERSIG | SCRIPT_VERIFY_LOW_S | SCRIPT_VERIFY_STRICTENC, false, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    // And if we produce a block with this tx, it should be valid (DERSIG not
    // enabled yet), even though there's no cache entry.
    CBlock block;

    block = CreateAndProcessBlock({spend_tx}, p2pk_scriptPubKey);
    LOCK(cs_main);
    BOOST_CHECK(m_node.chainman->ActiveChain().Tip()->GetBlockHash() == block.GetHash());
    BOOST_CHECK(m_node.chainman->ActiveChainstate().CoinsTip().GetBestBlock() == block.GetHash());

    // Test P2SH: construct a transaction that is valid without P2SH, and
    // then test validity with P2SH.
    {
        CMutableTransaction invalid_under_p2sh_tx;
        invalid_under_p2sh_tx.version = 1;
        invalid_under_p2sh_tx.vin.resize(1);
        invalid_under_p2sh_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_under_p2sh_tx.vin[0].prevout.n = 0;
        invalid_under_p2sh_tx.vout.resize(1);
        invalid_under_p2sh_tx.vout[0].nValue = 11*CENT;
        invalid_under_p2sh_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;
        std::vector<unsigned char> vchSig2(p2pk_scriptPubKey.begin(), p2pk_scriptPubKey.end());
        invalid_under_p2sh_tx.vin[0].scriptSig << vchSig2;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_under_p2sh_tx), SCRIPT_VERIFY_P2SH, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    // Test CHECKLOCKTIMEVERIFY
    {
        CMutableTransaction invalid_with_cltv_tx;
        invalid_with_cltv_tx.version = 1;
        invalid_with_cltv_tx.nLockTime = 100;
        invalid_with_cltv_tx.vin.resize(1);
        invalid_with_cltv_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_with_cltv_tx.vin[0].prevout.n = 2;
        invalid_with_cltv_tx.vin[0].nSequence = 0;
        invalid_with_cltv_tx.vout.resize(1);
        invalid_with_cltv_tx.vout[0].nValue = 11*CENT;
        invalid_with_cltv_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(spend_tx.vout[2].scriptPubKey, invalid_with_cltv_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        invalid_with_cltv_tx.vin[0].scriptSig = CScript() << vchSig << 101;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_with_cltv_tx), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Make it valid, and check again
        invalid_with_cltv_tx.vin[0].scriptSig = CScript() << vchSig << 100;
        TxValidationState state;
        PrecomputedTransactionData txdata;
        BOOST_CHECK(CheckInputScripts(CTransaction(invalid_with_cltv_tx), state, m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKLOCKTIMEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));
    }

    // TEST CHECKSEQUENCEVERIFY
    {
        CMutableTransaction invalid_with_csv_tx;
        invalid_with_csv_tx.version = 2;
        invalid_with_csv_tx.vin.resize(1);
        invalid_with_csv_tx.vin[0].prevout.hash = spend_tx.GetHash();
        invalid_with_csv_tx.vin[0].prevout.n = 3;
        invalid_with_csv_tx.vin[0].nSequence = 100;
        invalid_with_csv_tx.vout.resize(1);
        invalid_with_csv_tx.vout[0].nValue = 11*CENT;
        invalid_with_csv_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        std::vector<unsigned char> vchSig;
        uint256 hash = SignatureHash(spend_tx.vout[3].scriptPubKey, invalid_with_csv_tx, 0, SIGHASH_ALL, 0, SigVersion::BASE);
        BOOST_CHECK(coinbaseKey.Sign(hash, vchSig));
        vchSig.push_back((unsigned char)SIGHASH_ALL);
        invalid_with_csv_tx.vin[0].scriptSig = CScript() << vchSig << 101;

        ValidateCheckInputsForAllFlags(CTransaction(invalid_with_csv_tx), SCRIPT_VERIFY_CHECKSEQUENCEVERIFY, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Make it valid, and check again
        invalid_with_csv_tx.vin[0].scriptSig = CScript() << vchSig << 100;
        TxValidationState state;
        PrecomputedTransactionData txdata;
        BOOST_CHECK(CheckInputScripts(CTransaction(invalid_with_csv_tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_CHECKSEQUENCEVERIFY, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));
    }

    // TODO: add tests for remaining script flags

    // Test that passing CheckInputScripts with a valid witness doesn't imply success
    // for the same tx with a different witness.
    {
        CMutableTransaction valid_with_witness_tx;
        valid_with_witness_tx.version = 1;
        valid_with_witness_tx.vin.resize(1);
        valid_with_witness_tx.vin[0].prevout.hash = spend_tx.GetHash();
        valid_with_witness_tx.vin[0].prevout.n = 1;
        valid_with_witness_tx.vout.resize(1);
        valid_with_witness_tx.vout[0].nValue = 11*CENT;
        valid_with_witness_tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        SignatureData sigdata;
        BOOST_CHECK(ProduceSignature(keystore, MutableTransactionSignatureCreator(valid_with_witness_tx, 0, 11 * CENT, SIGHASH_ALL), spend_tx.vout[1].scriptPubKey, sigdata));
        UpdateInput(valid_with_witness_tx.vin[0], sigdata);

        // This should be valid under all script flags.
        ValidateCheckInputsForAllFlags(CTransaction(valid_with_witness_tx), 0, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Remove the witness, and check that it is now invalid.
        valid_with_witness_tx.vin[0].scriptWitness.SetNull();
        ValidateCheckInputsForAllFlags(CTransaction(valid_with_witness_tx), SCRIPT_VERIFY_WITNESS, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);
    }

    {
        // Test a transaction with multiple inputs.
        CMutableTransaction tx;

        tx.version = 1;
        tx.vin.resize(2);
        tx.vin[0].prevout.hash = spend_tx.GetHash();
        tx.vin[0].prevout.n = 0;
        tx.vin[1].prevout.hash = spend_tx.GetHash();
        tx.vin[1].prevout.n = 1;
        tx.vout.resize(1);
        tx.vout[0].nValue = 22*CENT;
        tx.vout[0].scriptPubKey = p2pk_scriptPubKey;

        // Sign
        for (int i = 0; i < 2; ++i) {
            SignatureData sigdata;
            BOOST_CHECK(ProduceSignature(keystore, MutableTransactionSignatureCreator(tx, i, 11 * CENT, SIGHASH_ALL), spend_tx.vout[i].scriptPubKey, sigdata));
            UpdateInput(tx.vin[i], sigdata);
        }

        // This should be valid under all script flags
        ValidateCheckInputsForAllFlags(CTransaction(tx), 0, true, m_node.chainman->ActiveChainstate().CoinsTip(), m_node.chainman->m_validation_cache);

        // Check that if the second input is invalid, but the first input is
        // valid, the transaction is not cached.
        // Invalidate vin[1]
        tx.vin[1].scriptWitness.SetNull();

        TxValidationState state;
        PrecomputedTransactionData txdata;
        // This transaction is now invalid under segwit, because of the second input.
        BOOST_CHECK(!CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, nullptr));

        std::vector<CScriptCheck> scriptchecks;
        // Make sure this transaction was not cached (ie because the first
        // input was valid)
        BOOST_CHECK(CheckInputScripts(CTransaction(tx), state, &m_node.chainman->ActiveChainstate().CoinsTip(), SCRIPT_VERIFY_P2SH | SCRIPT_VERIFY_WITNESS, true, true, txdata, m_node.chainman->m_validation_cache, &scriptchecks));
        // Should get 2 script checks back -- caching is on a whole-transaction basis.
        BOOST_CHECK_EQUAL(scriptchecks.size(), 2U);
    }
}